

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

cubeb_resampler *
cubeb_resampler_create_internal<short>
          (cubeb_stream *stream,cubeb_stream_params *input_params,cubeb_stream_params *output_params
          ,uint target_rate,cubeb_data_callback callback,void *user_ptr,
          cubeb_resampler_quality quality,cubeb_resampler_reclock reclock)

{
  bool bVar1;
  pointer pcVar2;
  pointer ptr;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  cubeb_resampler_quality in_stack_00000008;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> output_delay;
  unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> input_delay;
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  output_resampler;
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  input_resampler;
  int in_stack_00007f20;
  uint32_t in_stack_00007f24;
  uint32_t in_stack_00007f28;
  uint32_t in_stack_00007f2c;
  cubeb_resampler_speex_one_way<short> *in_stack_00007f30;
  pointer in_stack_ffffffffffffff08;
  cubeb_resampler_speex_one_way<short> *in_stack_ffffffffffffff10;
  cubeb_stream *in_stack_ffffffffffffff18;
  cubeb_resampler_speex_one_way<short> *in_stack_ffffffffffffff20;
  cubeb_resampler_speex_one_way<short> *in_stack_ffffffffffffff28;
  cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>
  *in_stack_ffffffffffffff30;
  cubeb_resampler_speex_one_way<short> *local_8;
  
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,std::default_delete<cubeb_resampler_speex_one_way<short>>>
  ::unique_ptr<std::default_delete<cubeb_resampler_speex_one_way<short>>,void>
            ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,std::default_delete<cubeb_resampler_speex_one_way<short>>>
  ::unique_ptr<std::default_delete<cubeb_resampler_speex_one_way<short>>,void>
            ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
              *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<delay_line<short>,std::default_delete<delay_line<short>>>::
  unique_ptr<std::default_delete<delay_line<short>>,void>
            ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::unique_ptr<delay_line<short>,std::default_delete<delay_line<short>>>::
  unique_ptr<std::default_delete<delay_line<short>>,void>
            ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  if ((((((in_RSI == 0) || (*(uint *)(in_RSI + 4) != in_ECX)) || (in_RDX == 0)) ||
       (*(uint *)(in_RDX + 4) != in_ECX)) &&
      (((in_RSI == 0 || (in_RDX != 0)) || (*(uint *)(in_RSI + 4) != in_ECX)))) &&
     (((in_RDX == 0 || (in_RSI != 0)) || (*(uint *)(in_RDX + 4) != in_ECX)))) {
    if ((in_RDX != 0) && (*(uint *)(in_RDX + 4) != in_ECX)) {
      operator_new(0x58);
      to_speex_quality(in_stack_00000008);
      cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                (in_stack_00007f30,in_stack_00007f2c,in_stack_00007f28,in_stack_00007f24,
                 in_stack_00007f20);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::reset((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x115494);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<short> *)0x0;
        goto LAB_001159ce;
      }
    }
    if ((in_RSI != 0) && (*(uint *)(in_RSI + 4) != in_ECX)) {
      operator_new(0x58);
      to_speex_quality(in_stack_00000008);
      cubeb_resampler_speex_one_way<short>::cubeb_resampler_speex_one_way
                (in_stack_00007f30,in_stack_00007f2c,in_stack_00007f28,in_stack_00007f24,
                 in_stack_00007f20);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::reset((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
               *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x115559);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<short> *)0x0;
        goto LAB_001159ce;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                        *)0x115588);
    if ((((!bVar1) ||
         (bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                              *)0x11559e), bVar1)) || (in_RSI == 0)) || (in_RDX == 0)) {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x11565b);
      if (((bVar1) &&
          (bVar1 = std::unique_ptr::operator_cast_to_bool
                             ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                               *)0x115671), !bVar1)) && ((in_RSI != 0 && (in_RDX != 0)))) {
        operator_new(0x48);
        std::
        unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
        ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                      *)0x1156b3);
        cubeb_resampler_speex_one_way<short>::latency(in_stack_ffffffffffffff10);
        delay_line<short>::delay_line
                  ((delay_line<short> *)in_stack_ffffffffffffff20,
                   (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                   (uint32_t)in_stack_ffffffffffffff18,
                   (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
        std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::reset
                  ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                   in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
        bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>
                            *)0x1156fc);
        if (!bVar1) {
          local_8 = (cubeb_resampler_speex_one_way<short> *)0x0;
          goto LAB_001159ce;
        }
      }
    }
    else {
      operator_new(0x48);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x1155e0);
      cubeb_resampler_speex_one_way<short>::latency(in_stack_ffffffffffffff10);
      delay_line<short>::delay_line
                ((delay_line<short> *)in_stack_ffffffffffffff20,
                 (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff18,
                 (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20));
      std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::reset
                ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                 in_stack_ffffffffffffff10,(pointer)in_stack_ffffffffffffff08);
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                         0x115629);
      if (!bVar1) {
        local_8 = (cubeb_resampler_speex_one_way<short> *)0x0;
        goto LAB_001159ce;
      }
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                        *)0x11572d);
    if ((bVar1) &&
       (bVar1 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                            *)0x115743), bVar1)) {
      if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
        (*g_cubeb_log_callback)
                  ("%s:%d: Resampling input (%d) and output (%d) to target rate of %dHz\n",
                   "cubeb_resampler_internal.h",0x236,(ulong)*(uint *)(in_RSI + 4),
                   (ulong)*(uint *)(in_RDX + 4),(ulong)in_ECX);
      }
      local_8 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x48);
      pcVar2 = std::
               unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
               ::release((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x1157cc);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::release((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                 *)0x1157de);
      cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
      ::cubeb_resampler_speex
                ((cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_cubeb_resampler_speex_one_way<short>_>
                  *)local_8,pcVar2,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (cubeb_data_callback)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    }
    else {
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                          *)0x115832);
      if (bVar1) {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling input (%d) to target and output rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x23d,(ulong)*(uint *)(in_RSI + 4),(ulong)in_ECX);
        }
        local_8 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x48);
        pcVar2 = std::
                 unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                 ::release((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                            *)0x1158af);
        std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::release
                  ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                   0x1158c1);
        cubeb_resampler_speex<short,_cubeb_resampler_speex_one_way<short>,_delay_line<short>_>::
        cubeb_resampler_speex
                  (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(delay_line<short> *)local_8,
                   (cubeb_stream *)pcVar2,(cubeb_data_callback)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08);
      }
      else {
        if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
          (*g_cubeb_log_callback)
                    ("%s:%d: Resampling output (%dHz) to target and input rate of %dHz\n",
                     "cubeb_resampler_internal.h",0x244,(ulong)*(uint *)(in_RDX + 4),(ulong)in_ECX);
        }
        in_stack_ffffffffffffff10 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x48);
        ptr = std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::release
                        ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
                         0x11597c);
        std::
        unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
        ::release((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                   *)0x11598d);
        cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>::
        cubeb_resampler_speex
                  ((cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
                    *)in_stack_ffffffffffffff30,(delay_line<short> *)in_stack_ffffffffffffff28,
                   in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (cubeb_data_callback)in_stack_ffffffffffffff10,ptr);
        local_8 = in_stack_ffffffffffffff10;
      }
    }
  }
  else {
    if ((g_cubeb_log_callback != (cubeb_log_callback)0x0) && (0 < (int)g_cubeb_log_level)) {
      (*g_cubeb_log_callback)
                ("%s:%d: Input and output sample-rate match, target rate of %dHz\n",
                 "cubeb_resampler_internal.h",0x206,(ulong)in_ECX);
    }
    local_8 = (cubeb_resampler_speex_one_way<short> *)operator_new(0x48);
    passthrough_resampler<short>::passthrough_resampler
              ((passthrough_resampler<short> *)in_stack_ffffffffffffff30,
               (cubeb_stream *)in_stack_ffffffffffffff28,
               (cubeb_data_callback)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (uint32_t)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (uint32_t)in_stack_ffffffffffffff10);
  }
LAB_001159ce:
  std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::~unique_ptr
            ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
             in_stack_ffffffffffffff10);
  std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::~unique_ptr
            ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)
             in_stack_ffffffffffffff10);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ::~unique_ptr((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                 *)in_stack_ffffffffffffff10);
  std::
  unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
  ::~unique_ptr((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                 *)in_stack_ffffffffffffff10);
  return (cubeb_resampler *)local_8;
}

Assistant:

cubeb_resampler *
cubeb_resampler_create_internal(cubeb_stream * stream,
                                cubeb_stream_params * input_params,
                                cubeb_stream_params * output_params,
                                unsigned int target_rate,
                                cubeb_data_callback callback, void * user_ptr,
                                cubeb_resampler_quality quality,
                                cubeb_resampler_reclock reclock)
{
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> input_resampler = nullptr;
  std::unique_ptr<cubeb_resampler_speex_one_way<T>> output_resampler = nullptr;
  std::unique_ptr<delay_line<T>> input_delay = nullptr;
  std::unique_ptr<delay_line<T>> output_delay = nullptr;

  assert((input_params || output_params) &&
         "need at least one valid parameter pointer.");

  /* All the streams we have have a sample rate that matches the target
     sample rate, use a no-op resampler, that simply forwards the buffers to the
     callback. */
  if (((input_params && input_params->rate == target_rate) &&
       (output_params && output_params->rate == target_rate)) ||
      (input_params && !output_params && (input_params->rate == target_rate)) ||
      (output_params && !input_params &&
       (output_params->rate == target_rate))) {
    LOG("Input and output sample-rate match, target rate of %dHz", target_rate);
    return new passthrough_resampler<T>(
        stream, callback, user_ptr, input_params ? input_params->channels : 0,
        target_rate);
  }

  /* Determine if we need to resampler one or both directions, and create the
     resamplers. */
  if (output_params && (output_params->rate != target_rate)) {
    output_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        output_params->channels, target_rate, output_params->rate,
        to_speex_quality(quality)));
    if (!output_resampler) {
      return NULL;
    }
  }

  if (input_params && (input_params->rate != target_rate)) {
    input_resampler.reset(new cubeb_resampler_speex_one_way<T>(
        input_params->channels, input_params->rate, target_rate,
        to_speex_quality(quality)));
    if (!input_resampler) {
      return NULL;
    }
  }

  /* If we resample only one direction but we have a duplex stream, insert a
   * delay line with a length equal to the resampler latency of the
   * other direction so that the streams are synchronized. */
  if (input_resampler && !output_resampler && input_params && output_params) {
    output_delay.reset(new delay_line<T>(input_resampler->latency(),
                                         output_params->channels,
                                         output_params->rate));
    if (!output_delay) {
      return NULL;
    }
  } else if (output_resampler && !input_resampler && input_params &&
             output_params) {
    input_delay.reset(new delay_line<T>(output_resampler->latency(),
                                        input_params->channels,
                                        output_params->rate));
    if (!input_delay) {
      return NULL;
    }
  }

  if (input_resampler && output_resampler) {
    LOG("Resampling input (%d) and output (%d) to target rate of %dHz",
        input_params->rate, output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_resampler.release(), output_resampler.release(), stream, callback,
        user_ptr);
  } else if (input_resampler) {
    LOG("Resampling input (%d) to target and output rate of %dHz",
        input_params->rate, target_rate);
    return new cubeb_resampler_speex<T, cubeb_resampler_speex_one_way<T>,
                                     delay_line<T>>(input_resampler.release(),
                                                    output_delay.release(),
                                                    stream, callback, user_ptr);
  } else {
    LOG("Resampling output (%dHz) to target and input rate of %dHz",
        output_params->rate, target_rate);
    return new cubeb_resampler_speex<T, delay_line<T>,
                                     cubeb_resampler_speex_one_way<T>>(
        input_delay.release(), output_resampler.release(), stream, callback,
        user_ptr);
  }
}